

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

void anon_unknown.dwarf_ddf01b::InheritQualifiers(TQualifier *child,TQualifier *parent)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = *(ulong *)&child->field_0x8;
  if (uVar1 >> 0x3d == 0) {
    uVar1 = uVar1 | *(ulong *)&parent->field_0x8 & 0xe000000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
  }
  uVar2 = *(ulong *)&parent->field_0x8;
  if (((uint)uVar2 >> 0x1c & 1) != 0) {
    uVar1 = uVar1 | 0x10000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((int)uVar2 < 0) {
    uVar1 = uVar1 | 0x80000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if (((uint)uVar2 >> 0x1d & 1) != 0) {
    uVar1 = uVar1 | 0x20000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x25 & 1) != 0) {
    uVar1 = uVar1 | 0x2000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x26 & 1) != 0) {
    uVar1 = uVar1 | 0x4000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x29 & 1) != 0) {
    uVar1 = uVar1 | 0x20000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x2a & 1) != 0) {
    uVar1 = uVar1 | 0x40000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x2b & 1) != 0) {
    uVar1 = uVar1 | 0x80000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if (((uint)uVar2 & 0x7f) == 0xf) {
    uVar1 = uVar1 & 0xffffffffffffff80 | 0xf;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x2c & 1) != 0) {
    uVar1 = uVar1 | 0x100000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x2d & 1) != 0) {
    uVar1 = uVar1 | 0x200000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x31 & 1) != 0) {
    uVar1 = uVar1 | 0x2000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x34 & 1) != 0) {
    uVar1 = uVar1 | 0x10000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x35 & 1) != 0) {
    uVar1 = uVar1 | 0x20000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x36 & 1) != 0) {
    uVar1 = uVar1 | 0x40000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x37 & 1) != 0) {
    uVar1 = uVar1 | 0x80000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x38 & 1) != 0) {
    uVar1 = uVar1 | 0x100000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x39 & 1) != 0) {
    uVar1 = uVar1 | 0x200000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x32 & 1) != 0) {
    uVar1 = uVar1 | 0x4000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x33 & 1) != 0) {
    uVar1 = uVar1 | 0x8000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x2e & 1) != 0) {
    uVar1 = uVar1 | 0x400000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x2f & 1) != 0) {
    uVar1 = uVar1 | 0x800000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x30 & 1) != 0) {
    uVar1 = uVar1 | 0x1000000000000;
    *(ulong *)&child->field_0x8 = uVar1;
    uVar2 = *(ulong *)&parent->field_0x8;
  }
  if ((uVar2 >> 0x21 & 1) != 0) {
    *(ulong *)&child->field_0x8 = uVar1 | 0x200000000;
  }
  return;
}

Assistant:

void InheritQualifiers(glslang::TQualifier& child, const glslang::TQualifier& parent)
{
    if (child.layoutMatrix == glslang::ElmNone)
        child.layoutMatrix = parent.layoutMatrix;

    if (parent.invariant)
        child.invariant = true;
    if (parent.flat)
        child.flat = true;
    if (parent.centroid)
        child.centroid = true;
    if (parent.nopersp)
        child.nopersp = true;
    if (parent.explicitInterp)
        child.explicitInterp = true;
    if (parent.perPrimitiveNV)
        child.perPrimitiveNV = true;
    if (parent.perViewNV)
        child.perViewNV = true;
    if (parent.perTaskNV)
        child.perTaskNV = true;
    if (parent.storage == glslang::EvqtaskPayloadSharedEXT)
        child.storage = glslang::EvqtaskPayloadSharedEXT;
    if (parent.patch)
        child.patch = true;
    if (parent.sample)
        child.sample = true;
    if (parent.coherent)
        child.coherent = true;
    if (parent.devicecoherent)
        child.devicecoherent = true;
    if (parent.queuefamilycoherent)
        child.queuefamilycoherent = true;
    if (parent.workgroupcoherent)
        child.workgroupcoherent = true;
    if (parent.subgroupcoherent)
        child.subgroupcoherent = true;
    if (parent.shadercallcoherent)
        child.shadercallcoherent = true;
    if (parent.nonprivate)
        child.nonprivate = true;
    if (parent.volatil)
        child.volatil = true;
    if (parent.nontemporal)
        child.nontemporal = true;
    if (parent.restrict)
        child.restrict = true;
    if (parent.readonly)
        child.readonly = true;
    if (parent.writeonly)
        child.writeonly = true;
    if (parent.nonUniform)
        child.nonUniform = true;
}